

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# struct_column_data.cpp
# Opt level: O0

void __thiscall
duckdb::StructColumnData::InitializeScanWithOffset
          (StructColumnData *this,ColumnScanState *state,idx_t row_idx)

{
  bool bVar1;
  size_type sVar2;
  reference pvVar3;
  undefined8 in_RDX;
  undefined8 *in_RSI;
  ColumnData *in_RDI;
  idx_t i;
  size_type in_stack_ffffffffffffffa8;
  pointer in_stack_ffffffffffffffb0;
  ColumnScanState *in_stack_ffffffffffffffb8;
  ulong uVar4;
  reference local_30;
  ulong local_20;
  undefined8 local_18;
  
  in_RSI[2] = in_RDX;
  *in_RSI = 0;
  local_18 = in_RDX;
  vector<duckdb::ColumnScanState,_true>::operator[]
            ((vector<duckdb::ColumnScanState,_true> *)in_stack_ffffffffffffffb0,
             in_stack_ffffffffffffffa8);
  ColumnData::InitializeScanWithOffset
            (in_RDI,in_stack_ffffffffffffffb8,(idx_t)in_stack_ffffffffffffffb0);
  local_20 = 0;
  while (uVar4 = local_20,
        sVar2 = ::std::
                vector<duckdb::unique_ptr<duckdb::ColumnData,_std::default_delete<duckdb::ColumnData>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnData,_std::default_delete<duckdb::ColumnData>,_true>_>_>
                ::size((vector<duckdb::unique_ptr<duckdb::ColumnData,_std::default_delete<duckdb::ColumnData>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnData,_std::default_delete<duckdb::ColumnData>,_true>_>_>
                        *)(in_RDI + 1)), uVar4 < sVar2) {
    local_30 = vector<bool,_true>::operator[]
                         ((vector<bool,_true> *)in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8)
    ;
    bVar1 = ::std::_Bit_reference::operator_cast_to_bool((_Bit_reference *)&local_30);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      vector<duckdb::unique_ptr<duckdb::ColumnData,_std::default_delete<duckdb::ColumnData>,_true>,_true>
      ::operator[]((vector<duckdb::unique_ptr<duckdb::ColumnData,_std::default_delete<duckdb::ColumnData>,_true>,_true>
                    *)in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
      in_stack_ffffffffffffffb0 =
           unique_ptr<duckdb::ColumnData,_std::default_delete<duckdb::ColumnData>,_true>::operator->
                     ((unique_ptr<duckdb::ColumnData,_std::default_delete<duckdb::ColumnData>,_true>
                       *)in_stack_ffffffffffffffb0);
      pvVar3 = vector<duckdb::ColumnScanState,_true>::operator[]
                         ((vector<duckdb::ColumnScanState,_true> *)in_stack_ffffffffffffffb0,
                          in_stack_ffffffffffffffa8);
      (*in_stack_ffffffffffffffb0->_vptr_ColumnData[8])(in_stack_ffffffffffffffb0,pvVar3,local_18);
    }
    local_20 = local_20 + 1;
  }
  return;
}

Assistant:

void StructColumnData::InitializeScanWithOffset(ColumnScanState &state, idx_t row_idx) {
	D_ASSERT(state.child_states.size() == sub_columns.size() + 1);
	state.row_index = row_idx;
	state.current = nullptr;

	// initialize the validity segment
	validity.InitializeScanWithOffset(state.child_states[0], row_idx);

	// initialize the sub-columns
	for (idx_t i = 0; i < sub_columns.size(); i++) {
		if (!state.scan_child_column[i]) {
			continue;
		}
		sub_columns[i]->InitializeScanWithOffset(state.child_states[i + 1], row_idx);
	}
}